

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::CopyBuffer
          (DeviceContextVkImpl *this,IBuffer *pSrcBuffer,Uint64 SrcOffset,
          RESOURCE_STATE_TRANSITION_MODE SrcBufferTransitionMode,IBuffer *pDstBuffer,
          Uint64 DstOffset,Uint64 Size,RESOURCE_STATE_TRANSITION_MODE DstBufferTransitionMode)

{
  Uint32 *pUVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pMVar3;
  size_t sVar4;
  VkBuffer srcBuffer;
  VkBuffer dstBuffer;
  ulong uVar5;
  ulong uVar6;
  char (*Args_2) [34];
  string msg;
  VkBufferCopy CopyRegion;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::CopyBuffer
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pSrcBuffer,SrcOffset,
             SrcBufferTransitionMode,pDstBuffer,DstOffset,Size,DstBufferTransitionMode);
  if (pSrcBuffer != (IBuffer *)0x0) {
    CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>(pSrcBuffer);
  }
  if (pDstBuffer != (IBuffer *)0x0) {
    CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>(pDstBuffer);
  }
  if (*(char *)((long)&pDstBuffer[5].super_IDeviceObject.super_IObject._vptr_IObject + 4) == '\x02')
  {
    FormatString<char[44]>(&msg,(char (*) [44])"Dynamic buffers cannot be copy destinations");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CopyBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x85c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  EnsureVkCmdBuffer(this);
  TransitionOrVerifyBufferState
            (this,(BufferVkImpl *)pSrcBuffer,SrcBufferTransitionMode,RESOURCE_STATE_COPY_SOURCE,
             VK_ACCESS_TRANSFER_READ_BIT,
             "Using buffer as copy source (DeviceContextVkImpl::CopyBuffer)");
  Args_2 = (char (*) [34])0x1000;
  TransitionOrVerifyBufferState
            (this,(BufferVkImpl *)pDstBuffer,DstBufferTransitionMode,RESOURCE_STATE_COPY_DEST,
             VK_ACCESS_TRANSFER_WRITE_BIT,
             "Using buffer as copy destination (DeviceContextVkImpl::CopyBuffer)");
  if (pSrcBuffer[0x15].super_IDeviceObject.super_IObject._vptr_IObject == (_func_int **)0x0) {
    DvpVerifyDynamicAllocation(this,(BufferVkImpl *)pSrcBuffer);
    uVar6 = (ulong)*(uint *)&pSrcBuffer[0xc].super_IDeviceObject.super_IObject._vptr_IObject;
    if (uVar6 == 0xffffffff) {
      FormatString<char[17],char_const*,char[34]>
                (&msg,(Diligent *)"Dynamic buffer \'",(char (*) [17])(pSrcBuffer + 3),
                 (char **)"\' does not have dynamic buffer ID",Args_2);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetDynamicBufferOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/DeviceContextVkImpl.hpp"
                 ,0x2a2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    pMVar3 = (this->m_MappedBuffers).
             super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(this->m_MappedBuffers).
                   super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar3 >> 3) *
            -0x3333333333333333;
    if (uVar6 <= uVar5 && uVar5 - uVar6 != 0) {
      sVar4 = pMVar3[uVar6].Allocation.AlignedOffset;
      goto LAB_0028bff5;
    }
  }
  sVar4 = 0;
LAB_0028bff5:
  CopyRegion.srcOffset = sVar4 + SrcOffset;
  CopyRegion.size = Size;
  CopyRegion.dstOffset = DstOffset;
  if (pDstBuffer[0x15].super_IDeviceObject.super_IObject._vptr_IObject == (_func_int **)0x0) {
    FormatString<char[49]>(&msg,(char (*) [49])"Copy destination buffer must not be suballocated");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CopyBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x866);
    paVar2 = &msg.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != paVar2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
    if (pDstBuffer[0x15].super_IDeviceObject.super_IObject._vptr_IObject == (_func_int **)0x0) {
      DvpVerifyDynamicAllocation(this,(BufferVkImpl *)pDstBuffer);
      uVar6 = (ulong)*(uint *)&pDstBuffer[0xc].super_IDeviceObject.super_IObject._vptr_IObject;
      if (uVar6 == 0xffffffff) {
        FormatString<char[17],char_const*,char[34]>
                  (&msg,(Diligent *)"Dynamic buffer \'",(char (*) [17])(pDstBuffer + 3),
                   (char **)"\' does not have dynamic buffer ID",Args_2);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"GetDynamicBufferOffset",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/DeviceContextVkImpl.hpp"
                   ,0x2a2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != paVar2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      pMVar3 = (this->m_MappedBuffers).
               super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->m_MappedBuffers).
                     super__Vector_base<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar3 >> 3) *
              -0x3333333333333333;
      if ((uVar6 <= uVar5 && uVar5 - uVar6 != 0) && (pMVar3[uVar6].Allocation.AlignedOffset != 0)) {
        FormatString<char[26],char[40]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"GetDynamicBufferOffset(pDstBuffVk) == 0",
                   (char (*) [40])(uVar6 * 5));
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"CopyBuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x867);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != paVar2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  srcBuffer = BufferVkImpl::GetVkBuffer((BufferVkImpl *)pSrcBuffer);
  dstBuffer = BufferVkImpl::GetVkBuffer((BufferVkImpl *)pDstBuffer);
  VulkanUtilities::VulkanCommandBuffer::CopyBuffer
            (&this->m_CommandBuffer,srcBuffer,dstBuffer,1,&CopyRegion);
  pUVar1 = &(this->m_State).NumCommands;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

void DeviceContextVkImpl::CopyBuffer(IBuffer*                       pSrcBuffer,
                                     Uint64                         SrcOffset,
                                     RESOURCE_STATE_TRANSITION_MODE SrcBufferTransitionMode,
                                     IBuffer*                       pDstBuffer,
                                     Uint64                         DstOffset,
                                     Uint64                         Size,
                                     RESOURCE_STATE_TRANSITION_MODE DstBufferTransitionMode)
{
    TDeviceContextBase::CopyBuffer(pSrcBuffer, SrcOffset, SrcBufferTransitionMode, pDstBuffer, DstOffset, Size, DstBufferTransitionMode);

    BufferVkImpl* pSrcBuffVk = ClassPtrCast<BufferVkImpl>(pSrcBuffer);
    BufferVkImpl* pDstBuffVk = ClassPtrCast<BufferVkImpl>(pDstBuffer);

    DEV_CHECK_ERR(pDstBuffVk->GetDesc().Usage != USAGE_DYNAMIC, "Dynamic buffers cannot be copy destinations");

    EnsureVkCmdBuffer();
    TransitionOrVerifyBufferState(*pSrcBuffVk, SrcBufferTransitionMode, RESOURCE_STATE_COPY_SOURCE, VK_ACCESS_TRANSFER_READ_BIT, "Using buffer as copy source (DeviceContextVkImpl::CopyBuffer)");
    TransitionOrVerifyBufferState(*pDstBuffVk, DstBufferTransitionMode, RESOURCE_STATE_COPY_DEST, VK_ACCESS_TRANSFER_WRITE_BIT, "Using buffer as copy destination (DeviceContextVkImpl::CopyBuffer)");

    VkBufferCopy CopyRegion;
    CopyRegion.srcOffset = SrcOffset + GetDynamicBufferOffset(pSrcBuffVk);
    CopyRegion.dstOffset = DstOffset;
    CopyRegion.size      = Size;
    VERIFY(pDstBuffVk->m_VulkanBuffer != VK_NULL_HANDLE, "Copy destination buffer must not be suballocated");
    VERIFY_EXPR(GetDynamicBufferOffset(pDstBuffVk) == 0);
    m_CommandBuffer.CopyBuffer(pSrcBuffVk->GetVkBuffer(), pDstBuffVk->GetVkBuffer(), 1, &CopyRegion);
    ++m_State.NumCommands;
}